

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int connectionIsBusy(sqlite3 *db)

{
  Btree *p;
  int iVar1;
  long in_RDI;
  Btree *pBt;
  int j;
  int local_14;
  int local_4;
  
  if (*(long *)(in_RDI + 8) == 0) {
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x28); local_14 = local_14 + 1) {
      p = *(Btree **)(*(long *)(in_RDI + 0x20) + (long)local_14 * 0x20 + 8);
      if ((p != (Btree *)0x0) && (iVar1 = sqlite3BtreeIsInBackup(p), iVar1 != 0)) {
        return 1;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int connectionIsBusy(sqlite3 *db){
  int j;
  assert( sqlite3_mutex_held(db->mutex) );
  if( db->pVdbe ) return 1;
  for(j=0; j<db->nDb; j++){
    Btree *pBt = db->aDb[j].pBt;
    if( pBt && sqlite3BtreeIsInBackup(pBt) ) return 1;
  }
  return 0;
}